

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

int __thiscall kj::WaitScope::poll(WaitScope *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  EventLoop *pEVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Fault f;
  Fault local_18;
  
  pEVar1 = this->loop;
  if (pEVar1 != *(EventLoop **)(in_FS_OFFSET + -0x10)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x196,FAILED,"&loop == threadLocalEventLoop",
               "\"WaitScope not valid for this thread.\"",
               (char (*) [37])"WaitScope not valid for this thread.");
    _::Debug::Fault::fatal(&local_18);
  }
  if (pEVar1->running != true) {
    pEVar1->running = true;
    do {
      do {
        bVar2 = EventLoop::turn(this->loop);
      } while (bVar2);
      (*this->loop->port->_vptr_EventPort[1])();
      pEVar1 = this->loop;
    } while (pEVar1->head != (Event *)0x0);
    pEVar1->running = false;
    return (int)pEVar1;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x197,FAILED,"!loop.running","\"poll() is not allowed from within event callbacks.\"",
             (char (*) [51])"poll() is not allowed from within event callbacks.");
  _::Debug::Fault::fatal(&local_18);
}

Assistant:

void WaitScope::poll() {
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  loop.running = true;
  KJ_DEFER(loop.running = false);

  for (;;) {
    if (!loop.turn()) {
      // No events in the queue.  Poll for I/O.
      loop.port.poll();

      if (!loop.isRunnable()) {
        // Still no events in the queue. We're done.
        return;
      }
    }
  }
}